

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O3

void __thiscall
booster::locale::boundary::details::
segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::update_current(segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *this,pair<unsigned_long,_unsigned_long> pos)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var1;
  element_type *peVar2;
  long lVar3;
  unsigned_long uVar4;
  long lVar5;
  long lVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  difference_type __d_1;
  pointer pbVar9;
  unsigned_long uVar10;
  pointer pbVar11;
  pointer pbVar12;
  difference_type __d;
  pointer pbVar13;
  
  uVar8 = pos.second;
  uVar10 = pos.first;
  peVar2 = (this->map_->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar3 = (long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pbVar11 = (peVar2->
            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = (long)pbVar11 - lVar3 >> 4;
  pbVar11 = pbVar11 + -0x10;
  pbVar12 = (pointer)(uVar10 * 0x10 + lVar3);
  if (uVar7 == uVar10) {
    pbVar12 = pbVar11;
  }
  uVar4 = (this->current_).first;
  pbVar13 = (pointer)(uVar4 * 0x10 + lVar3);
  if (uVar7 == uVar4) {
    pbVar13 = pbVar11;
  }
  uVar4 = (this->current_).second;
  pbVar9 = (pointer)(lVar3 + uVar8 * 0x10);
  if (uVar7 == uVar8) {
    pbVar9 = pbVar11;
  }
  lVar5 = *(long *)pbVar9;
  pbVar9 = (pointer)(uVar4 * 0x10 + lVar3);
  if (uVar7 == uVar4) {
    pbVar9 = pbVar11;
  }
  lVar6 = *(long *)pbVar9;
  (this->value_).
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current =
       (this->value_).
       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .first._M_current + (*(long *)pbVar12 - *(long *)pbVar13);
  p_Var1 = &(this->value_).
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .second;
  p_Var1->_M_current = p_Var1->_M_current + (lVar5 - lVar6);
  (this->current_).first = uVar10;
  (this->current_).second = uVar8;
  if (uVar7 != uVar8) {
    (this->value_).rule_ = *(rule_type *)(lVar3 + 8 + uVar8 * 0x10);
  }
  return;
}

Assistant:

index_type const &index() const
                    {
                        return map_->index();
                    }